

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_60e82::PhonyCommand::getVerboseDescription
          (PhonyCommand *this,SmallVectorImpl<char> *result)

{
  StringRef Str;
  raw_svector_ostream local_48;
  SmallVectorImpl<char> *local_18;
  SmallVectorImpl<char> *result_local;
  PhonyCommand *this_local;
  
  local_18 = result;
  result_local = (SmallVectorImpl<char> *)this;
  llvm::raw_svector_ostream::raw_svector_ostream(&local_48,result);
  Str = llbuild::buildsystem::Command::getName((Command *)this);
  llvm::raw_ostream::operator<<((raw_ostream *)&local_48,Str);
  llvm::raw_svector_ostream::~raw_svector_ostream(&local_48);
  return;
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream(result) << getName();
  }